

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O1

bool __thiscall
anurbs::TypeEntry<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_anurbs::Model>::
save(TypeEntry<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_anurbs::Model>
     *this,Model *model,size_t index,Json *target)

{
  pointer *ppsVar1;
  element_type *peVar2;
  Attributes *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *data;
  Model *this_02;
  bool bVar3;
  Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_> entry;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_02 = (Model *)&stack0xffffffffffffffd0;
  Model::get<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>>(this_02,(size_t)model);
  if (local_30 == (element_type *)0x0) {
    bVar3 = true;
  }
  else {
    peVar2 = (local_30->m_data).
             super___shared_ptr<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    this_02 = (Model *)(local_30->m_data).
                       super___shared_ptr<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
    if (this_02 != (Model *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppsVar1 = &(this_02->m_entries).
                   super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
        UNLOCK();
      }
      else {
        ppsVar1 = &(this_02->m_entries).
                   super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
      }
    }
    bVar3 = peVar2 == (element_type *)0x0;
  }
  if (this_02 != (Model *)0x0 && local_30 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
  }
  if (bVar3 == false) {
    data = Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>::operator*
                     ((Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_> *)
                      &stack0xffffffffffffffd0);
    Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::save(model,data,target);
    this_00 = (local_30->m_attributes).
              super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01 = (local_30->m_attributes).
              super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    Attributes::
    save<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (this_00,model,target);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool save(const TModel& model, const size_t index, Json& target) override
    {
        const auto entry = model.template get<TData>(index);

        if (entry.is_empty() || entry.data() == nullptr) {
            return false;
        }

        TData::save(model, *entry, target);
        entry.attributes()->save(model, target);

        return true;
    }